

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O3

void __thiscall
ModelFlattening_flatteningModelsRequiringUnitsNameChangesInvolvingImportedComponents_Test::
~ModelFlattening_flatteningModelsRequiringUnitsNameChangesInvolvingImportedComponents_Test
          (ModelFlattening_flatteningModelsRequiringUnitsNameChangesInvolvingImportedComponents_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ModelFlattening, flatteningModelsRequiringUnitsNameChangesInvolvingImportedComponents)
{
    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();

    auto model = parser->parseModel(fileContents("importer/HHComplete/MembraneModel.cellml"));
    importer->resolveImports(model, resourcePath("importer/HHComplete"));

    EXPECT_FALSE(model->hasUnresolvedImports());

    auto flatModel = importer->flattenModel(model);
    EXPECT_NE(nullptr, flatModel);
}